

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O2

void icu_63::initTZDataVersion(UErrorCode *status)

{
  UResourceBundle *resB;
  UChar *us;
  int32_t len;
  
  ucln_i18n_registerCleanup_63(UCLN_I18N_TIMEZONE,timeZone_cleanup);
  len = 0;
  resB = ures_openDirect_63((char *)0x0,"zoneinfo64",status);
  us = ures_getStringByKey_63(resB,"TZVersion",&len,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (0xf < len) {
      len = 0xf;
    }
    u_UCharsToChars_63(us,TZDATA_VERSION,len);
  }
  ures_close_63(resB);
  return;
}

Assistant:

static void U_CALLCONV initTZDataVersion(UErrorCode &status) {
    ucln_i18n_registerCleanup(UCLN_I18N_TIMEZONE, timeZone_cleanup);
    int32_t len = 0;
    UResourceBundle *bundle = ures_openDirect(NULL, kZONEINFO, &status);
    const UChar *tzver = ures_getStringByKey(bundle, kTZVERSION, &len, &status);

    if (U_SUCCESS(status)) {
        if (len >= (int32_t)sizeof(TZDATA_VERSION)) {
            // Ensure that there is always space for a trailing nul in TZDATA_VERSION
            len = sizeof(TZDATA_VERSION) - 1;
        }
        u_UCharsToChars(tzver, TZDATA_VERSION, len);
    }
    ures_close(bundle);

}